

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PortSymbols.cpp
# Opt level: O3

void __thiscall
slang::ast::PortConnection::makeConnections
          (PortConnection *this,InstanceSymbol *instance,
          span<const_slang::ast::Symbol_*const,_18446744073709551615UL> ports,
          SeparatedSyntaxList<slang::syntax::PortConnectionSyntax> *portConnections,
          SmallVector<const_slang::ast::PortConnection_*,_5UL> *results)

{
  group_type_pointer pgVar1;
  SymbolKind SVar2;
  Symbol *pSVar3;
  ConstantRange CVar4;
  PortSymbol *args;
  PortConnectionSyntax *pPVar5;
  size_t sVar6;
  int iVar7;
  ushort uVar8;
  bool bVar9;
  span<const_slang::syntax::AttributeInstanceSyntax_*const,_18446744073709551615UL> syntax;
  span<const_slang::syntax::AttributeInstanceSyntax_*const,_18446744073709551615UL> syntax_00;
  span<const_slang::syntax::AttributeInstanceSyntax_*const,_18446744073709551615UL> syntax_01;
  ConstantRange *pCVar10;
  InstanceSymbolBase *pIVar11;
  undefined8 this_00;
  value_type_pointer ppVar12;
  bool bVar13;
  bool bVar14;
  uint uVar15;
  Scope *pSVar16;
  ConstantRange *pCVar17;
  SourceLocation SVar18;
  Diagnostic *pDVar19;
  PortConnection *pPVar20;
  uint64_t uVar21;
  char_pointer puVar22;
  pointer pCVar23;
  char_pointer puVar24;
  PropertyExprSyntax *pPVar25;
  ulong uVar26;
  long lVar27;
  ulong uVar28;
  basic_string_view<char,_std::char_traits<char>_> *pbVar29;
  table_element_pointer ppVar30;
  ulong uVar31;
  byte bVar32;
  InstanceArraySymbol *sym;
  char_pointer puVar33;
  bool bVar34;
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  uchar uVar41;
  uchar uVar42;
  uchar uVar43;
  byte bVar44;
  uchar uVar45;
  uchar uVar46;
  uchar uVar47;
  byte bVar48;
  uchar uVar49;
  uchar uVar50;
  uchar uVar51;
  byte bVar52;
  uchar uVar53;
  uchar uVar54;
  uchar uVar55;
  byte bVar56;
  LookupLocation LVar57;
  span<const_slang::ast::AttributeSymbol_*const,_18446744073709551615UL> sVar58;
  SourceRange SVar59;
  iterator iVar60;
  string_view arg;
  LookupLocation lookupLocation;
  LookupLocation lookupLocation_00;
  LookupLocation lookupLocation_01;
  LookupLocation lookupLocation_02;
  LookupLocation lookupLocation_03;
  LookupLocation lookupLocation_04;
  PortConnection *conn_2;
  PortConnection *conn;
  PortConnectionBuilder builder;
  bool local_311;
  basic_string_view<char,_std::char_traits<char>_> *local_310;
  group_type_pointer local_308;
  ulong local_300;
  ulong local_2f8;
  ulong local_2f0;
  Token local_2e8;
  uchar local_2d8;
  uchar uStack_2d7;
  uchar uStack_2d6;
  byte bStack_2d5;
  uchar uStack_2d4;
  uchar uStack_2d3;
  uchar uStack_2d2;
  byte bStack_2d1;
  uchar uStack_2d0;
  uchar uStack_2cf;
  uchar uStack_2ce;
  byte bStack_2cd;
  uchar uStack_2cc;
  uchar uStack_2cb;
  uchar uStack_2ca;
  byte bStack_2c9;
  SeparatedSyntaxList<slang::syntax::PortConnectionSyntax> *local_2c0;
  PortConnection *local_2b8;
  ulong local_2b0;
  undefined1 local_2a8 [376];
  table<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedPortConnectionSyntax_*,_bool>_>,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedPortConnectionSyntax_*,_bool>_>,_256UL,_16UL>_>
  local_130;
  span<const_slang::ast::AttributeSymbol_*const,_18446744073709551615UL> local_f8;
  SourceRange local_e8;
  bool local_d8;
  bool local_d7;
  SmallVectorBase<slang::ConstantRange> local_c8;
  ulong local_90;
  undefined2 local_88;
  uchar local_78;
  uchar uStack_77;
  uchar uStack_76;
  byte bStack_75;
  uchar uStack_74;
  uchar uStack_73;
  uchar uStack_72;
  byte bStack_71;
  uchar uStack_70;
  uchar uStack_6f;
  uchar uStack_6e;
  byte bStack_6d;
  uchar uStack_6c;
  uchar uStack_6b;
  uchar uStack_6a;
  byte bStack_69;
  uchar local_68;
  uchar uStack_67;
  uchar uStack_66;
  byte bStack_65;
  uchar uStack_64;
  uchar uStack_63;
  uchar uStack_62;
  byte bStack_61;
  uchar uStack_60;
  uchar uStack_5f;
  uchar uStack_5e;
  byte bStack_5d;
  uchar uStack_5c;
  uchar uStack_5b;
  uchar uStack_5a;
  byte bStack_59;
  uchar local_58;
  uchar uStack_57;
  uchar uStack_56;
  byte bStack_55;
  uchar uStack_54;
  uchar uStack_53;
  uchar uStack_52;
  byte bStack_51;
  uchar uStack_50;
  uchar uStack_4f;
  uchar uStack_4e;
  byte bStack_4d;
  uchar uStack_4c;
  uchar uStack_4b;
  uchar uStack_4a;
  byte bStack_49;
  uchar local_48;
  uchar uStack_47;
  uchar uStack_46;
  byte bStack_45;
  uchar uStack_44;
  uchar uStack_43;
  uchar uStack_42;
  byte bStack_41;
  uchar uStack_40;
  uchar uStack_3f;
  uchar uStack_3e;
  byte bStack_3d;
  uchar uStack_3c;
  uchar uStack_3b;
  uchar uStack_3a;
  byte bStack_39;
  
  pSVar16 = (Scope *)(this->field_4).exprSyntax;
  local_2a8._16_8_ = pSVar16->compilation;
  local_2c0 = portConnections;
  local_2a8._0_8_ = pSVar16;
  local_2a8._8_8_ = this;
  LVar57 = LookupLocation::after((Symbol *)this);
  local_2a8._24_8_ = LVar57.scope;
  local_2a8._32_4_ = LVar57.index;
  lookupLocation._12_4_ = 0;
  lookupLocation.scope = (Scope *)SUB128(LVar57._0_12_,0);
  lookupLocation.index = SUB124(LVar57._0_12_,8);
  ConnMap::ConnMap((ConnMap *)(local_2a8 + 0x30),
                   (SeparatedSyntaxList<slang::syntax::PortConnectionSyntax> *)
                   ports._M_extent._M_extent_value._M_extent_value,pSVar16,lookupLocation);
  local_c8.data_ = (pointer)local_c8.firstElement;
  local_c8.len = 0;
  local_c8.cap = 4;
  local_90 = 0;
  local_88._0_1_ = false;
  local_88._1_1_ = false;
  if ((Scope *)local_2a8._0_8_ != (Scope *)0x0) {
    pSVar16 = (Scope *)local_2a8._0_8_;
    do {
      pSVar3 = pSVar16->thisSym;
      if (pSVar3->kind != InstanceArray) break;
      SmallVectorBase<slang::ConstantRange>::emplace_back<slang::ConstantRange_const&>
                (&local_c8,(ConstantRange *)&pSVar3[2].name);
      pSVar16 = pSVar3->parentScope;
    } while (pSVar16 != (Scope *)0x0);
    pCVar23 = local_c8.data_ + (local_c8.len - 1);
    pCVar10 = local_c8.data_;
    if (local_c8.data_ < pCVar23 && local_c8.len != 0) {
      do {
        pCVar17 = pCVar10 + 1;
        CVar4 = *pCVar10;
        *pCVar10 = *pCVar23;
        *pCVar23 = CVar4;
        pCVar23 = pCVar23 + -1;
        pCVar10 = pCVar17;
      } while (pCVar17 < pCVar23);
    }
  }
  if (ports._M_ptr != (pointer)0x0) {
    pIVar11 = &instance->super_InstanceSymbolBase;
    do {
      args = *(PortSymbol **)&(instance->super_InstanceSymbolBase).super_Symbol;
      SVar2 = (args->super_Symbol).kind;
      if (SVar2 == MultiPort) {
        local_2e8.info = (Info *)local_2a8;
        local_2e8._0_8_ = args;
        if (local_d8 == true) {
          uVar28 = local_90 + 1;
          if ((ulong)local_2a8._56_8_ <= local_90) goto LAB_0036ef46;
          pPVar5 = *(pointer)(local_2a8._48_8_ + local_90 * 8);
          syntax_00._M_ptr =
               (pPVar5->attributes).
               super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>._M_ptr;
          syntax_00._M_extent._M_extent_value =
               (pPVar5->attributes).
               super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>.
               _M_extent._M_extent_value;
          lookupLocation_01.index = local_2a8._32_4_;
          lookupLocation_01.scope = (Scope *)local_2a8._24_8_;
          lookupLocation_01._12_4_ = 0;
          local_90 = local_90 + 1;
          sVar58 = AttributeSymbol::fromSyntax(syntax_00,(Scope *)local_2a8._0_8_,lookupLocation_01)
          ;
          if ((pPVar5->super_SyntaxNode).kind == OrderedPortConnection) {
            pPVar25 = *(PropertyExprSyntax **)&pPVar5[1].super_SyntaxNode;
LAB_0036eccd:
            pPVar20 = anon_unknown_0::PortConnectionBuilder::
                      createConnection<slang::ast::MultiPortSymbol>
                                ((PortConnectionBuilder *)local_2a8,(MultiPortSymbol *)args,pPVar25,
                                 sVar58);
          }
          else {
            local_311 = false;
            pPVar20 = BumpAllocator::
                      emplace<slang::ast::PortConnection,slang::ast::MultiPortSymbol_const&,bool>
                                ((BumpAllocator *)local_2a8._16_8_,(MultiPortSymbol *)args,
                                 &local_311);
            if (sVar58._M_extent._M_extent_value._M_extent_value != 0) {
              Compilation::setAttributes((Compilation *)local_2a8._16_8_,pPVar20,sVar58);
            }
          }
        }
        else {
          uVar28 = local_90;
          if ((args->super_Symbol).name._M_len != 0) {
            pbVar29 = &(args->super_Symbol).name;
            uVar21 = hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>::operator()
                               ((hash<std::basic_string_view<char,_std::char_traits<char>_>,_void> *
                                )&local_130,pbVar29);
            uVar28 = uVar21 >> ((byte)local_130.
                                      super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_std::pair<const_slang::syntax::NamedPortConnectionSyntax_*,_bool>_>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char>,_std::pair<const_slang::syntax::NamedPortConnectionSyntax_*,_bool>_>,_256UL>_>
                                      .arrays.groups_size_index & 0x3f);
            lVar27 = (uVar21 & 0xff) * 4;
            uVar41 = (&UNK_0051239c)[lVar27];
            uVar42 = (&UNK_0051239d)[lVar27];
            uVar43 = (&UNK_0051239e)[lVar27];
            bVar44 = (&UNK_0051239f)[lVar27];
            uVar26 = 0;
            uVar45 = uVar41;
            uVar46 = uVar42;
            uVar47 = uVar43;
            bVar48 = bVar44;
            uVar49 = uVar41;
            uVar50 = uVar42;
            uVar51 = uVar43;
            bVar52 = bVar44;
            uVar53 = uVar41;
            uVar54 = uVar42;
            uVar55 = uVar43;
            bVar56 = bVar44;
            do {
              ppVar12 = local_130.
                        super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_std::pair<const_slang::syntax::NamedPortConnectionSyntax_*,_bool>_>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char>,_std::pair<const_slang::syntax::NamedPortConnectionSyntax_*,_bool>_>,_256UL>_>
                        .arrays.elements_;
              pgVar1 = local_130.
                       super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_std::pair<const_slang::syntax::NamedPortConnectionSyntax_*,_bool>_>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char>,_std::pair<const_slang::syntax::NamedPortConnectionSyntax_*,_bool>_>,_256UL>_>
                       .arrays.groups_ + uVar28;
              local_48 = pgVar1->m[0].n;
              uStack_47 = pgVar1->m[1].n;
              uStack_46 = pgVar1->m[2].n;
              bStack_45 = pgVar1->m[3].n;
              uStack_44 = pgVar1->m[4].n;
              uStack_43 = pgVar1->m[5].n;
              uStack_42 = pgVar1->m[6].n;
              bStack_41 = pgVar1->m[7].n;
              uStack_40 = pgVar1->m[8].n;
              uStack_3f = pgVar1->m[9].n;
              uStack_3e = pgVar1->m[10].n;
              bStack_3d = pgVar1->m[0xb].n;
              uStack_3c = pgVar1->m[0xc].n;
              uStack_3b = pgVar1->m[0xd].n;
              uStack_3a = pgVar1->m[0xe].n;
              bVar32 = pgVar1->m[0xf].n;
              auVar37[0] = -(local_48 == uVar41);
              auVar37[1] = -(uStack_47 == uVar42);
              auVar37[2] = -(uStack_46 == uVar43);
              auVar37[3] = -(bStack_45 == bVar44);
              auVar37[4] = -(uStack_44 == uVar45);
              auVar37[5] = -(uStack_43 == uVar46);
              auVar37[6] = -(uStack_42 == uVar47);
              auVar37[7] = -(bStack_41 == bVar48);
              auVar37[8] = -(uStack_40 == uVar49);
              auVar37[9] = -(uStack_3f == uVar50);
              auVar37[10] = -(uStack_3e == uVar51);
              auVar37[0xb] = -(bStack_3d == bVar52);
              auVar37[0xc] = -(uStack_3c == uVar53);
              auVar37[0xd] = -(uStack_3b == uVar54);
              auVar37[0xe] = -(uStack_3a == uVar55);
              auVar37[0xf] = -(bVar32 == bVar56);
              uVar15 = (uint)(ushort)((ushort)(SUB161(auVar37 >> 7,0) & 1) |
                                      (ushort)(SUB161(auVar37 >> 0xf,0) & 1) << 1 |
                                      (ushort)(SUB161(auVar37 >> 0x17,0) & 1) << 2 |
                                      (ushort)(SUB161(auVar37 >> 0x1f,0) & 1) << 3 |
                                      (ushort)(SUB161(auVar37 >> 0x27,0) & 1) << 4 |
                                      (ushort)(SUB161(auVar37 >> 0x2f,0) & 1) << 5 |
                                      (ushort)(SUB161(auVar37 >> 0x37,0) & 1) << 6 |
                                      (ushort)(SUB161(auVar37 >> 0x3f,0) & 1) << 7 |
                                      (ushort)(SUB161(auVar37 >> 0x47,0) & 1) << 8 |
                                      (ushort)(SUB161(auVar37 >> 0x4f,0) & 1) << 9 |
                                      (ushort)(SUB161(auVar37 >> 0x57,0) & 1) << 10 |
                                      (ushort)(SUB161(auVar37 >> 0x5f,0) & 1) << 0xb |
                                      (ushort)(SUB161(auVar37 >> 0x67,0) & 1) << 0xc |
                                      (ushort)(SUB161(auVar37 >> 0x6f,0) & 1) << 0xd |
                                     (ushort)(SUB161(auVar37 >> 0x77,0) & 1) << 0xe);
              bStack_39 = bVar32;
              if (uVar15 != 0) {
                local_308 = local_130.
                            super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_std::pair<const_slang::syntax::NamedPortConnectionSyntax_*,_bool>_>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char>,_std::pair<const_slang::syntax::NamedPortConnectionSyntax_*,_bool>_>,_256UL>_>
                            .arrays.groups_ + uVar28;
                local_310 = pbVar29;
                local_300 = uVar26;
                local_2f8 = uVar28;
                local_2d8 = uVar41;
                uStack_2d7 = uVar42;
                uStack_2d6 = uVar43;
                bStack_2d5 = bVar44;
                uStack_2d4 = uVar45;
                uStack_2d3 = uVar46;
                uStack_2d2 = uVar47;
                bStack_2d1 = bVar48;
                uStack_2d0 = uVar49;
                uStack_2cf = uVar50;
                uStack_2ce = uVar51;
                bStack_2cd = bVar52;
                uStack_2cc = uVar53;
                uStack_2cb = uVar54;
                uStack_2ca = uVar55;
                bStack_2c9 = bVar56;
                do {
                  local_2f0 = (ulong)uVar15;
                  iVar7 = 0;
                  if (uVar15 != 0) {
                    for (; (uVar15 >> iVar7 & 1) == 0; iVar7 = iVar7 + 1) {
                    }
                  }
                  pbVar29 = (basic_string_view<char,_std::char_traits<char>_> *)
                            ((long)&ppVar12[uVar28 * 0xf].first._M_len + (ulong)(uint)(iVar7 << 5));
                  bVar14 = std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>::
                           operator()((equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>
                                       *)&local_130,local_310,pbVar29);
                  if (bVar14) {
                    sVar6 = pbVar29[1]._M_len;
                    *(undefined1 *)&pbVar29[1]._M_str = 1;
                    LVar57.index = local_2a8._32_4_;
                    LVar57.scope = (Scope *)local_2a8._24_8_;
                    LVar57._12_4_ = 0;
                    sVar58 = AttributeSymbol::fromSyntax
                                       (*(span<const_slang::syntax::AttributeInstanceSyntax_*const,_18446744073709551615UL>
                                          *)(sVar6 + 0x40),(Scope *)local_2a8._0_8_,LVar57);
                    if (*(long *)(sVar6 + 0x78) == 0) {
                      SVar59 = parsing::Token::range((Token *)(sVar6 + 0x60));
                      bVar14 = false;
                      goto LAB_0036f5ff;
                    }
                    pPVar25 = *(PropertyExprSyntax **)(sVar6 + 0x80);
                    if (pPVar25 != (PropertyExprSyntax *)0x0) goto LAB_0036eccd;
                    pPVar20 = BumpAllocator::
                              emplace<slang::ast::PortConnection,slang::ast::MultiPortSymbol_const&>
                                        ((BumpAllocator *)local_2a8._16_8_,(MultiPortSymbol *)args);
                    goto LAB_0036ef53;
                  }
                  uVar15 = (uint)local_2f0 - 1 & (uint)local_2f0;
                } while (uVar15 != 0);
                bVar32 = local_308->m[0xf].n;
                uVar28 = local_2f8;
                pbVar29 = local_310;
                uVar26 = local_300;
                uVar41 = local_2d8;
                uVar42 = uStack_2d7;
                uVar43 = uStack_2d6;
                bVar44 = bStack_2d5;
                uVar45 = uStack_2d4;
                uVar46 = uStack_2d3;
                uVar47 = uStack_2d2;
                bVar48 = bStack_2d1;
                uVar49 = uStack_2d0;
                uVar50 = uStack_2cf;
                uVar51 = uStack_2ce;
                bVar52 = bStack_2cd;
                uVar53 = uStack_2cc;
                uVar54 = uStack_2cb;
                uVar55 = uStack_2ca;
                bVar56 = bStack_2c9;
              }
              if (((&boost::unordered::detail::foa::
                     group15<boost::unordered::detail::foa::plain_integral>::
                     is_not_overflowed(unsigned_long)::shift)[(uint)uVar21 & 7] & bVar32) == 0)
              break;
              lVar27 = uVar28 + uVar26;
              uVar26 = uVar26 + 1;
              uVar28 = lVar27 + 1U &
                       local_130.
                       super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_std::pair<const_slang::syntax::NamedPortConnectionSyntax_*,_bool>_>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char>,_std::pair<const_slang::syntax::NamedPortConnectionSyntax_*,_bool>_>,_256UL>_>
                       .arrays.groups_size_mask;
            } while (uVar26 <= local_130.
                               super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_std::pair<const_slang::syntax::NamedPortConnectionSyntax_*,_bool>_>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char>,_std::pair<const_slang::syntax::NamedPortConnectionSyntax_*,_bool>_>,_256UL>_>
                               .arrays.groups_size_mask);
            uVar28 = local_90;
            if (local_d7 == true) {
              bVar14 = true;
              sVar58 = local_f8;
              SVar59 = local_e8;
LAB_0036f5ff:
              pPVar20 = anon_unknown_0::PortConnectionBuilder::
                        implicitNamedPort<slang::ast::MultiPortSymbol>
                                  ((PortConnectionBuilder *)local_2a8,(MultiPortSymbol *)args,sVar58
                                   ,SVar59,bVar14);
              goto LAB_0036ef53;
            }
          }
LAB_0036ef46:
          local_90 = uVar28;
          pPVar20 = anon_unknown_0::PortConnectionBuilder::
                    getConnection<slang::ast::MultiPortSymbol>::anon_class_16_2_3fb12ad6::operator()
                              ((anon_class_16_2_3fb12ad6 *)&local_2e8);
        }
LAB_0036ef53:
        local_2b8 = pPVar20;
        SmallVectorBase<slang::ast::PortConnection_const*>::
        emplace_back<slang::ast::PortConnection_const*const&>
                  ((SmallVectorBase<slang::ast::PortConnection_const*> *)local_2c0,&local_2b8);
      }
      else if (SVar2 == Port) {
        local_2e8.info = (Info *)local_2a8;
        local_2e8._0_8_ = args;
        bVar14 = args->initializerSyntax == (ExpressionSyntax *)0x0;
        bVar9 = args->initializer == (Expression *)0x0;
        bVar34 = args->direction != In;
        if (local_d8 == true) {
          uVar28 = local_90 + 1;
          if (local_90 < (ulong)local_2a8._56_8_) {
            pPVar5 = *(pointer)(local_2a8._48_8_ + local_90 * 8);
            syntax._M_ptr =
                 (pPVar5->attributes).
                 super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>._M_ptr
            ;
            syntax._M_extent._M_extent_value =
                 (pPVar5->attributes).
                 super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>.
                 _M_extent._M_extent_value;
            lookupLocation_00.index = local_2a8._32_4_;
            lookupLocation_00.scope = (Scope *)local_2a8._24_8_;
            lookupLocation_00._12_4_ = 0;
            local_90 = uVar28;
            sVar58 = AttributeSymbol::fromSyntax(syntax,(Scope *)local_2a8._0_8_,lookupLocation_00);
            if ((pPVar5->super_SyntaxNode).kind == OrderedPortConnection) {
              pPVar25 = *(PropertyExprSyntax **)&pPVar5[1].super_SyntaxNode;
LAB_0036ec28:
              local_2b8 = anon_unknown_0::PortConnectionBuilder::
                          createConnection<slang::ast::PortSymbol>
                                    ((PortConnectionBuilder *)local_2a8,args,pPVar25,sVar58);
            }
            else {
              local_2b8 = anon_unknown_0::PortConnectionBuilder::defaultConnection
                                    ((PortConnectionBuilder *)local_2a8,args,sVar58);
            }
          }
          else {
            local_90 = uVar28;
            if (bVar34 || bVar14 && bVar9) goto LAB_0036f644;
            local_311 = true;
            local_2b8 = BumpAllocator::
                        emplace<slang::ast::PortConnection,slang::ast::PortSymbol_const&,bool>
                                  ((BumpAllocator *)local_2a8._16_8_,args,&local_311);
          }
        }
        else if ((args->super_Symbol).name._M_len == 0) {
LAB_0036f644:
          local_2b8 = anon_unknown_0::PortConnectionBuilder::getConnection<slang::ast::PortSymbol>::
                      anon_class_16_2_3fb12ad6::operator()((anon_class_16_2_3fb12ad6 *)&local_2e8);
        }
        else {
          pbVar29 = &(args->super_Symbol).name;
          uVar21 = hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>::operator()
                             ((hash<std::basic_string_view<char,_std::char_traits<char>_>,_void> *)
                              &local_130,pbVar29);
          uVar26 = uVar21 >> ((byte)local_130.
                                    super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_std::pair<const_slang::syntax::NamedPortConnectionSyntax_*,_bool>_>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char>,_std::pair<const_slang::syntax::NamedPortConnectionSyntax_*,_bool>_>,_256UL>_>
                                    .arrays.groups_size_index & 0x3f);
          lVar27 = (uVar21 & 0xff) * 4;
          uVar41 = (&UNK_0051239c)[lVar27];
          uVar42 = (&UNK_0051239d)[lVar27];
          uVar43 = (&UNK_0051239e)[lVar27];
          bVar44 = (&UNK_0051239f)[lVar27];
          uVar28 = (ulong)((uint)uVar21 & 7);
          uVar31 = 0;
          uVar45 = uVar41;
          uVar46 = uVar42;
          uVar47 = uVar43;
          bVar48 = bVar44;
          uVar49 = uVar41;
          uVar50 = uVar42;
          uVar51 = uVar43;
          bVar52 = bVar44;
          uVar53 = uVar41;
          uVar54 = uVar42;
          uVar55 = uVar43;
          bVar56 = bVar44;
          do {
            ppVar12 = local_130.
                      super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_std::pair<const_slang::syntax::NamedPortConnectionSyntax_*,_bool>_>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char>,_std::pair<const_slang::syntax::NamedPortConnectionSyntax_*,_bool>_>,_256UL>_>
                      .arrays.elements_;
            pgVar1 = local_130.
                     super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_std::pair<const_slang::syntax::NamedPortConnectionSyntax_*,_bool>_>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char>,_std::pair<const_slang::syntax::NamedPortConnectionSyntax_*,_bool>_>,_256UL>_>
                     .arrays.groups_ + uVar26;
            local_58 = pgVar1->m[0].n;
            uStack_57 = pgVar1->m[1].n;
            uStack_56 = pgVar1->m[2].n;
            bStack_55 = pgVar1->m[3].n;
            uStack_54 = pgVar1->m[4].n;
            uStack_53 = pgVar1->m[5].n;
            uStack_52 = pgVar1->m[6].n;
            bStack_51 = pgVar1->m[7].n;
            uStack_50 = pgVar1->m[8].n;
            uStack_4f = pgVar1->m[9].n;
            uStack_4e = pgVar1->m[10].n;
            bStack_4d = pgVar1->m[0xb].n;
            uStack_4c = pgVar1->m[0xc].n;
            uStack_4b = pgVar1->m[0xd].n;
            uStack_4a = pgVar1->m[0xe].n;
            bVar32 = pgVar1->m[0xf].n;
            auVar35[0] = -(local_58 == uVar41);
            auVar35[1] = -(uStack_57 == uVar42);
            auVar35[2] = -(uStack_56 == uVar43);
            auVar35[3] = -(bStack_55 == bVar44);
            auVar35[4] = -(uStack_54 == uVar45);
            auVar35[5] = -(uStack_53 == uVar46);
            auVar35[6] = -(uStack_52 == uVar47);
            auVar35[7] = -(bStack_51 == bVar48);
            auVar35[8] = -(uStack_50 == uVar49);
            auVar35[9] = -(uStack_4f == uVar50);
            auVar35[10] = -(uStack_4e == uVar51);
            auVar35[0xb] = -(bStack_4d == bVar52);
            auVar35[0xc] = -(uStack_4c == uVar53);
            auVar35[0xd] = -(uStack_4b == uVar54);
            auVar35[0xe] = -(uStack_4a == uVar55);
            auVar35[0xf] = -(bVar32 == bVar56);
            uVar15 = (uint)(ushort)((ushort)(SUB161(auVar35 >> 7,0) & 1) |
                                    (ushort)(SUB161(auVar35 >> 0xf,0) & 1) << 1 |
                                    (ushort)(SUB161(auVar35 >> 0x17,0) & 1) << 2 |
                                    (ushort)(SUB161(auVar35 >> 0x1f,0) & 1) << 3 |
                                    (ushort)(SUB161(auVar35 >> 0x27,0) & 1) << 4 |
                                    (ushort)(SUB161(auVar35 >> 0x2f,0) & 1) << 5 |
                                    (ushort)(SUB161(auVar35 >> 0x37,0) & 1) << 6 |
                                    (ushort)(SUB161(auVar35 >> 0x3f,0) & 1) << 7 |
                                    (ushort)(SUB161(auVar35 >> 0x47,0) & 1) << 8 |
                                    (ushort)(SUB161(auVar35 >> 0x4f,0) & 1) << 9 |
                                    (ushort)(SUB161(auVar35 >> 0x57,0) & 1) << 10 |
                                    (ushort)(SUB161(auVar35 >> 0x5f,0) & 1) << 0xb |
                                    (ushort)(SUB161(auVar35 >> 0x67,0) & 1) << 0xc |
                                    (ushort)(SUB161(auVar35 >> 0x6f,0) & 1) << 0xd |
                                   (ushort)(SUB161(auVar35 >> 0x77,0) & 1) << 0xe);
            bStack_49 = bVar32;
            if (uVar15 != 0) {
              local_308 = local_130.
                          super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_std::pair<const_slang::syntax::NamedPortConnectionSyntax_*,_bool>_>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char>,_std::pair<const_slang::syntax::NamedPortConnectionSyntax_*,_bool>_>,_256UL>_>
                          .arrays.groups_ + uVar26;
              local_310 = pbVar29;
              local_300 = uVar31;
              local_2f8 = uVar26;
              local_2d8 = uVar41;
              uStack_2d7 = uVar42;
              uStack_2d6 = uVar43;
              bStack_2d5 = bVar44;
              uStack_2d4 = uVar45;
              uStack_2d3 = uVar46;
              uStack_2d2 = uVar47;
              bStack_2d1 = bVar48;
              uStack_2d0 = uVar49;
              uStack_2cf = uVar50;
              uStack_2ce = uVar51;
              bStack_2cd = bVar52;
              uStack_2cc = uVar53;
              uStack_2cb = uVar54;
              uStack_2ca = uVar55;
              bStack_2c9 = bVar56;
              local_2b0 = uVar28;
              do {
                local_2f0 = (ulong)uVar15;
                iVar7 = 0;
                if (uVar15 != 0) {
                  for (; (uVar15 >> iVar7 & 1) == 0; iVar7 = iVar7 + 1) {
                  }
                }
                pbVar29 = (basic_string_view<char,_std::char_traits<char>_> *)
                          ((long)&ppVar12[uVar26 * 0xf].first._M_len + (ulong)(uint)(iVar7 << 5));
                bVar13 = std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>::
                         operator()((equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>
                                     *)&local_130,local_310,pbVar29);
                if (bVar13) {
                  sVar6 = pbVar29[1]._M_len;
                  *(undefined1 *)&pbVar29[1]._M_str = 1;
                  lookupLocation_03.index = local_2a8._32_4_;
                  lookupLocation_03.scope = (Scope *)local_2a8._24_8_;
                  lookupLocation_03._12_4_ = 0;
                  sVar58 = AttributeSymbol::fromSyntax
                                     (*(span<const_slang::syntax::AttributeInstanceSyntax_*const,_18446744073709551615UL>
                                        *)(sVar6 + 0x40),(Scope *)local_2a8._0_8_,lookupLocation_03)
                  ;
                  if (*(long *)(sVar6 + 0x78) == 0) {
                    SVar59 = parsing::Token::range((Token *)(sVar6 + 0x60));
                    bVar14 = false;
                    goto LAB_0036f5cd;
                  }
                  pPVar25 = *(PropertyExprSyntax **)(sVar6 + 0x80);
                  if (pPVar25 != (PropertyExprSyntax *)0x0) goto LAB_0036ec28;
                  local_2b8 = BumpAllocator::
                              emplace<slang::ast::PortConnection,slang::ast::PortSymbol_const&>
                                        ((BumpAllocator *)local_2a8._16_8_,args);
                  goto LAB_0036f64e;
                }
                uVar15 = (uint)local_2f0 - 1 & (uint)local_2f0;
              } while (uVar15 != 0);
              bVar32 = local_308->m[0xf].n;
              uVar28 = local_2b0;
              uVar26 = local_2f8;
              pbVar29 = local_310;
              uVar31 = local_300;
              uVar41 = local_2d8;
              uVar42 = uStack_2d7;
              uVar43 = uStack_2d6;
              bVar44 = bStack_2d5;
              uVar45 = uStack_2d4;
              uVar46 = uStack_2d3;
              uVar47 = uStack_2d2;
              bVar48 = bStack_2d1;
              uVar49 = uStack_2d0;
              uVar50 = uStack_2cf;
              uVar51 = uStack_2ce;
              bVar52 = bStack_2cd;
              uVar53 = uStack_2cc;
              uVar54 = uStack_2cb;
              uVar55 = uStack_2ca;
              bVar56 = bStack_2c9;
            }
            if (((&boost::unordered::detail::foa::
                   group15<boost::unordered::detail::foa::plain_integral>::
                   is_not_overflowed(unsigned_long)::shift)[uVar28] & bVar32) == 0) break;
            lVar27 = uVar26 + uVar31;
            uVar31 = uVar31 + 1;
            uVar26 = lVar27 + 1U &
                     local_130.
                     super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_std::pair<const_slang::syntax::NamedPortConnectionSyntax_*,_bool>_>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char>,_std::pair<const_slang::syntax::NamedPortConnectionSyntax_*,_bool>_>,_256UL>_>
                     .arrays.groups_size_mask;
          } while (uVar31 <= local_130.
                             super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_std::pair<const_slang::syntax::NamedPortConnectionSyntax_*,_bool>_>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char>,_std::pair<const_slang::syntax::NamedPortConnectionSyntax_*,_bool>_>,_256UL>_>
                             .arrays.groups_size_mask);
          if (local_d7 == true) {
            bVar14 = true;
            sVar58 = local_f8;
            SVar59 = local_e8;
LAB_0036f5cd:
            local_2b8 = anon_unknown_0::PortConnectionBuilder::
                        implicitNamedPort<slang::ast::PortSymbol>
                                  ((PortConnectionBuilder *)local_2a8,args,sVar58,SVar59,bVar14);
          }
          else {
            if (bVar34 || bVar14 && bVar9) goto LAB_0036f644;
            local_311 = true;
            local_2b8 = BumpAllocator::
                        emplace<slang::ast::PortConnection,slang::ast::PortSymbol_const&,bool>
                                  ((BumpAllocator *)local_2a8._16_8_,args,&local_311);
          }
        }
LAB_0036f64e:
        SmallVectorBase<slang::ast::PortConnection_const*>::
        emplace_back<slang::ast::PortConnection_const*const&>
                  ((SmallVectorBase<slang::ast::PortConnection_const*> *)local_2c0,&local_2b8);
      }
      else {
        if (((args->internalSymbol == (Symbol *)0x0) && (((ulong)args->type & 1) == 0)) ||
           ((args->super_Symbol).name._M_len == 0)) {
          if (local_d8 == true) {
            local_90 = local_90 + 1;
          }
          else {
            pbVar29 = &(args->super_Symbol).name;
            uVar21 = hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>::operator()
                               ((hash<std::basic_string_view<char,_std::char_traits<char>_>,_void> *
                                )&local_130,pbVar29);
            uVar28 = uVar21 >> ((byte)local_130.
                                      super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_std::pair<const_slang::syntax::NamedPortConnectionSyntax_*,_bool>_>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char>,_std::pair<const_slang::syntax::NamedPortConnectionSyntax_*,_bool>_>,_256UL>_>
                                      .arrays.groups_size_index & 0x3f);
            lVar27 = (uVar21 & 0xff) * 4;
            uVar41 = (&UNK_0051239c)[lVar27];
            uVar42 = (&UNK_0051239d)[lVar27];
            uVar43 = (&UNK_0051239e)[lVar27];
            bVar44 = (&UNK_0051239f)[lVar27];
            uVar26 = 0;
            uVar45 = uVar41;
            uVar46 = uVar42;
            uVar47 = uVar43;
            bVar48 = bVar44;
            uVar49 = uVar41;
            uVar50 = uVar42;
            uVar51 = uVar43;
            bVar52 = bVar44;
            uVar53 = uVar41;
            uVar54 = uVar42;
            uVar55 = uVar43;
            bVar56 = bVar44;
            do {
              ppVar12 = local_130.
                        super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_std::pair<const_slang::syntax::NamedPortConnectionSyntax_*,_bool>_>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char>,_std::pair<const_slang::syntax::NamedPortConnectionSyntax_*,_bool>_>,_256UL>_>
                        .arrays.elements_;
              pgVar1 = local_130.
                       super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_std::pair<const_slang::syntax::NamedPortConnectionSyntax_*,_bool>_>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char>,_std::pair<const_slang::syntax::NamedPortConnectionSyntax_*,_bool>_>,_256UL>_>
                       .arrays.groups_ + uVar28;
              local_78 = pgVar1->m[0].n;
              uStack_77 = pgVar1->m[1].n;
              uStack_76 = pgVar1->m[2].n;
              bStack_75 = pgVar1->m[3].n;
              uStack_74 = pgVar1->m[4].n;
              uStack_73 = pgVar1->m[5].n;
              uStack_72 = pgVar1->m[6].n;
              bStack_71 = pgVar1->m[7].n;
              uStack_70 = pgVar1->m[8].n;
              uStack_6f = pgVar1->m[9].n;
              uStack_6e = pgVar1->m[10].n;
              bStack_6d = pgVar1->m[0xb].n;
              uStack_6c = pgVar1->m[0xc].n;
              uStack_6b = pgVar1->m[0xd].n;
              uStack_6a = pgVar1->m[0xe].n;
              bVar32 = pgVar1->m[0xf].n;
              auVar36[0] = -(local_78 == uVar41);
              auVar36[1] = -(uStack_77 == uVar42);
              auVar36[2] = -(uStack_76 == uVar43);
              auVar36[3] = -(bStack_75 == bVar44);
              auVar36[4] = -(uStack_74 == uVar45);
              auVar36[5] = -(uStack_73 == uVar46);
              auVar36[6] = -(uStack_72 == uVar47);
              auVar36[7] = -(bStack_71 == bVar48);
              auVar36[8] = -(uStack_70 == uVar49);
              auVar36[9] = -(uStack_6f == uVar50);
              auVar36[10] = -(uStack_6e == uVar51);
              auVar36[0xb] = -(bStack_6d == bVar52);
              auVar36[0xc] = -(uStack_6c == uVar53);
              auVar36[0xd] = -(uStack_6b == uVar54);
              auVar36[0xe] = -(uStack_6a == uVar55);
              auVar36[0xf] = -(bVar32 == bVar56);
              uVar15 = (uint)(ushort)((ushort)(SUB161(auVar36 >> 7,0) & 1) |
                                      (ushort)(SUB161(auVar36 >> 0xf,0) & 1) << 1 |
                                      (ushort)(SUB161(auVar36 >> 0x17,0) & 1) << 2 |
                                      (ushort)(SUB161(auVar36 >> 0x1f,0) & 1) << 3 |
                                      (ushort)(SUB161(auVar36 >> 0x27,0) & 1) << 4 |
                                      (ushort)(SUB161(auVar36 >> 0x2f,0) & 1) << 5 |
                                      (ushort)(SUB161(auVar36 >> 0x37,0) & 1) << 6 |
                                      (ushort)(SUB161(auVar36 >> 0x3f,0) & 1) << 7 |
                                      (ushort)(SUB161(auVar36 >> 0x47,0) & 1) << 8 |
                                      (ushort)(SUB161(auVar36 >> 0x4f,0) & 1) << 9 |
                                      (ushort)(SUB161(auVar36 >> 0x57,0) & 1) << 10 |
                                      (ushort)(SUB161(auVar36 >> 0x5f,0) & 1) << 0xb |
                                      (ushort)(SUB161(auVar36 >> 0x67,0) & 1) << 0xc |
                                      (ushort)(SUB161(auVar36 >> 0x6f,0) & 1) << 0xd |
                                     (ushort)(SUB161(auVar36 >> 0x77,0) & 1) << 0xe);
              bStack_69 = bVar32;
              if (uVar15 != 0) {
                local_308 = local_130.
                            super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_std::pair<const_slang::syntax::NamedPortConnectionSyntax_*,_bool>_>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char>,_std::pair<const_slang::syntax::NamedPortConnectionSyntax_*,_bool>_>,_256UL>_>
                            .arrays.groups_ + uVar28;
                local_310 = pbVar29;
                local_300 = uVar26;
                local_2f8 = uVar28;
                local_2d8 = uVar41;
                uStack_2d7 = uVar42;
                uStack_2d6 = uVar43;
                bStack_2d5 = bVar44;
                uStack_2d4 = uVar45;
                uStack_2d3 = uVar46;
                uStack_2d2 = uVar47;
                bStack_2d1 = bVar48;
                uStack_2d0 = uVar49;
                uStack_2cf = uVar50;
                uStack_2ce = uVar51;
                bStack_2cd = bVar52;
                uStack_2cc = uVar53;
                uStack_2cb = uVar54;
                uStack_2ca = uVar55;
                bStack_2c9 = bVar56;
                do {
                  local_2f0 = (ulong)uVar15;
                  iVar7 = 0;
                  if (uVar15 != 0) {
                    for (; (uVar15 >> iVar7 & 1) == 0; iVar7 = iVar7 + 1) {
                    }
                  }
                  pbVar29 = (basic_string_view<char,_std::char_traits<char>_> *)
                            ((long)&ppVar12[uVar28 * 0xf].first._M_len + (ulong)(uint)(iVar7 << 5));
                  bVar14 = std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>::
                           operator()((equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>
                                       *)&local_130,local_310,pbVar29);
                  if (bVar14) {
                    *(undefined1 *)&pbVar29[1]._M_str = 1;
                    goto LAB_0036efe1;
                  }
                  uVar15 = (uint)local_2f0 - 1 & (uint)local_2f0;
                } while (uVar15 != 0);
                bVar32 = local_308->m[0xf].n;
                uVar28 = local_2f8;
                uVar26 = local_300;
                pbVar29 = local_310;
                uVar41 = local_2d8;
                uVar42 = uStack_2d7;
                uVar43 = uStack_2d6;
                bVar44 = bStack_2d5;
                uVar45 = uStack_2d4;
                uVar46 = uStack_2d3;
                uVar47 = uStack_2d2;
                bVar48 = bStack_2d1;
                uVar49 = uStack_2d0;
                uVar50 = uStack_2cf;
                uVar51 = uStack_2ce;
                bVar52 = bStack_2cd;
                uVar53 = uStack_2cc;
                uVar54 = uStack_2cb;
                uVar55 = uStack_2ca;
                bVar56 = bStack_2c9;
              }
              if (((&boost::unordered::detail::foa::
                     group15<boost::unordered::detail::foa::plain_integral>::
                     is_not_overflowed(unsigned_long)::shift)[(uint)uVar21 & 7] & bVar32) == 0)
              break;
              lVar27 = uVar28 + uVar26;
              uVar26 = uVar26 + 1;
              uVar28 = lVar27 + 1U &
                       local_130.
                       super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_std::pair<const_slang::syntax::NamedPortConnectionSyntax_*,_bool>_>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char>,_std::pair<const_slang::syntax::NamedPortConnectionSyntax_*,_bool>_>,_256UL>_>
                       .arrays.groups_size_mask;
            } while (uVar26 <= local_130.
                               super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_std::pair<const_slang::syntax::NamedPortConnectionSyntax_*,_bool>_>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char>,_std::pair<const_slang::syntax::NamedPortConnectionSyntax_*,_bool>_>,_256UL>_>
                               .arrays.groups_size_mask);
          }
LAB_0036efe1:
          pPVar20 = BumpAllocator::
                    emplace<slang::ast::PortConnection,slang::ast::InterfacePortSymbol_const&>
                              ((BumpAllocator *)local_2a8._16_8_,(InterfacePortSymbol *)args);
        }
        else {
          if (local_d8 == true) {
            if (local_90 < (ulong)local_2a8._56_8_) {
              pPVar5 = *(pointer)(local_2a8._48_8_ + local_90 * 8);
              syntax_01._M_ptr =
                   (pPVar5->attributes).
                   super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>.
                   _M_ptr;
              syntax_01._M_extent._M_extent_value =
                   (pPVar5->attributes).
                   super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>.
                   _M_extent._M_extent_value;
              lookupLocation_02.index = local_2a8._32_4_;
              lookupLocation_02.scope = (Scope *)local_2a8._24_8_;
              lookupLocation_02._12_4_ = 0;
              sVar58 = AttributeSymbol::fromSyntax
                                 (syntax_01,(Scope *)local_2a8._0_8_,lookupLocation_02);
              if ((pPVar5->super_SyntaxNode).kind != OrderedPortConnection) goto LAB_0036ef94;
              pPVar25 = *(PropertyExprSyntax **)&pPVar5[1].super_SyntaxNode;
              local_90 = local_90 + 1;
              if (pPVar25 != (PropertyExprSyntax *)0x0) {
LAB_0036ed8d:
                pPVar20 = anon_unknown_0::PortConnectionBuilder::getInterfaceExpr
                                    ((PortConnectionBuilder *)local_2a8,(InterfacePortSymbol *)args,
                                     pPVar25,sVar58);
                goto LAB_0036eff1;
              }
            }
            else {
LAB_0036ef94:
              local_90 = local_90 + 1;
            }
            pDVar19 = Scope::addDiag((Scope *)local_2a8._0_8_,(DiagCode)0x530006,
                                     *(SourceLocation *)(local_2a8._8_8_ + 0x18));
            Diagnostic::operator<<(pDVar19,(args->super_Symbol).name);
LAB_0036efd0:
            Diagnostic::addNote(pDVar19,(DiagCode)0x50001,(args->super_Symbol).location);
            goto LAB_0036efe1;
          }
          pbVar29 = &(args->super_Symbol).name;
          uVar21 = hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>::operator()
                             ((hash<std::basic_string_view<char,_std::char_traits<char>_>,_void> *)
                              &local_130,pbVar29);
          uVar28 = uVar21 >> ((byte)local_130.
                                    super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_std::pair<const_slang::syntax::NamedPortConnectionSyntax_*,_bool>_>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char>,_std::pair<const_slang::syntax::NamedPortConnectionSyntax_*,_bool>_>,_256UL>_>
                                    .arrays.groups_size_index & 0x3f);
          lVar27 = (uVar21 & 0xff) * 4;
          uVar41 = (&UNK_0051239c)[lVar27];
          uVar42 = (&UNK_0051239d)[lVar27];
          uVar43 = (&UNK_0051239e)[lVar27];
          bVar44 = (&UNK_0051239f)[lVar27];
          uVar26 = 0;
          uVar45 = uVar41;
          uVar46 = uVar42;
          uVar47 = uVar43;
          bVar48 = bVar44;
          uVar49 = uVar41;
          uVar50 = uVar42;
          uVar51 = uVar43;
          bVar52 = bVar44;
          uVar53 = uVar41;
          uVar54 = uVar42;
          uVar55 = uVar43;
          bVar56 = bVar44;
          do {
            ppVar12 = local_130.
                      super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_std::pair<const_slang::syntax::NamedPortConnectionSyntax_*,_bool>_>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char>,_std::pair<const_slang::syntax::NamedPortConnectionSyntax_*,_bool>_>,_256UL>_>
                      .arrays.elements_;
            pgVar1 = local_130.
                     super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_std::pair<const_slang::syntax::NamedPortConnectionSyntax_*,_bool>_>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char>,_std::pair<const_slang::syntax::NamedPortConnectionSyntax_*,_bool>_>,_256UL>_>
                     .arrays.groups_ + uVar28;
            local_68 = pgVar1->m[0].n;
            uStack_67 = pgVar1->m[1].n;
            uStack_66 = pgVar1->m[2].n;
            bStack_65 = pgVar1->m[3].n;
            uStack_64 = pgVar1->m[4].n;
            uStack_63 = pgVar1->m[5].n;
            uStack_62 = pgVar1->m[6].n;
            bStack_61 = pgVar1->m[7].n;
            uStack_60 = pgVar1->m[8].n;
            uStack_5f = pgVar1->m[9].n;
            uStack_5e = pgVar1->m[10].n;
            bStack_5d = pgVar1->m[0xb].n;
            uStack_5c = pgVar1->m[0xc].n;
            uStack_5b = pgVar1->m[0xd].n;
            uStack_5a = pgVar1->m[0xe].n;
            bVar32 = pgVar1->m[0xf].n;
            auVar38[0] = -(local_68 == uVar41);
            auVar38[1] = -(uStack_67 == uVar42);
            auVar38[2] = -(uStack_66 == uVar43);
            auVar38[3] = -(bStack_65 == bVar44);
            auVar38[4] = -(uStack_64 == uVar45);
            auVar38[5] = -(uStack_63 == uVar46);
            auVar38[6] = -(uStack_62 == uVar47);
            auVar38[7] = -(bStack_61 == bVar48);
            auVar38[8] = -(uStack_60 == uVar49);
            auVar38[9] = -(uStack_5f == uVar50);
            auVar38[10] = -(uStack_5e == uVar51);
            auVar38[0xb] = -(bStack_5d == bVar52);
            auVar38[0xc] = -(uStack_5c == uVar53);
            auVar38[0xd] = -(uStack_5b == uVar54);
            auVar38[0xe] = -(uStack_5a == uVar55);
            auVar38[0xf] = -(bVar32 == bVar56);
            uVar15 = (uint)(ushort)((ushort)(SUB161(auVar38 >> 7,0) & 1) |
                                    (ushort)(SUB161(auVar38 >> 0xf,0) & 1) << 1 |
                                    (ushort)(SUB161(auVar38 >> 0x17,0) & 1) << 2 |
                                    (ushort)(SUB161(auVar38 >> 0x1f,0) & 1) << 3 |
                                    (ushort)(SUB161(auVar38 >> 0x27,0) & 1) << 4 |
                                    (ushort)(SUB161(auVar38 >> 0x2f,0) & 1) << 5 |
                                    (ushort)(SUB161(auVar38 >> 0x37,0) & 1) << 6 |
                                    (ushort)(SUB161(auVar38 >> 0x3f,0) & 1) << 7 |
                                    (ushort)(SUB161(auVar38 >> 0x47,0) & 1) << 8 |
                                    (ushort)(SUB161(auVar38 >> 0x4f,0) & 1) << 9 |
                                    (ushort)(SUB161(auVar38 >> 0x57,0) & 1) << 10 |
                                    (ushort)(SUB161(auVar38 >> 0x5f,0) & 1) << 0xb |
                                    (ushort)(SUB161(auVar38 >> 0x67,0) & 1) << 0xc |
                                    (ushort)(SUB161(auVar38 >> 0x6f,0) & 1) << 0xd |
                                   (ushort)(SUB161(auVar38 >> 0x77,0) & 1) << 0xe);
            bStack_59 = bVar32;
            if (uVar15 != 0) {
              local_308 = local_130.
                          super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_std::pair<const_slang::syntax::NamedPortConnectionSyntax_*,_bool>_>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char>,_std::pair<const_slang::syntax::NamedPortConnectionSyntax_*,_bool>_>,_256UL>_>
                          .arrays.groups_ + uVar28;
              local_310 = pbVar29;
              local_300 = uVar26;
              local_2f8 = uVar28;
              local_2d8 = uVar41;
              uStack_2d7 = uVar42;
              uStack_2d6 = uVar43;
              bStack_2d5 = bVar44;
              uStack_2d4 = uVar45;
              uStack_2d3 = uVar46;
              uStack_2d2 = uVar47;
              bStack_2d1 = bVar48;
              uStack_2d0 = uVar49;
              uStack_2cf = uVar50;
              uStack_2ce = uVar51;
              bStack_2cd = bVar52;
              uStack_2cc = uVar53;
              uStack_2cb = uVar54;
              uStack_2ca = uVar55;
              bStack_2c9 = bVar56;
              do {
                local_2f0 = (ulong)uVar15;
                iVar7 = 0;
                if (uVar15 != 0) {
                  for (; (uVar15 >> iVar7 & 1) == 0; iVar7 = iVar7 + 1) {
                  }
                }
                pbVar29 = (basic_string_view<char,_std::char_traits<char>_> *)
                          ((long)&ppVar12[uVar28 * 0xf].first._M_len + (ulong)(uint)(iVar7 << 5));
                bVar14 = std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>::
                         operator()((equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>
                                     *)&local_130,local_310,pbVar29);
                if (bVar14) {
                  sVar6 = pbVar29[1]._M_len;
                  *(undefined1 *)&pbVar29[1]._M_str = 1;
                  lookupLocation_04.index = local_2a8._32_4_;
                  lookupLocation_04.scope = (Scope *)local_2a8._24_8_;
                  lookupLocation_04._12_4_ = 0;
                  sVar58 = AttributeSymbol::fromSyntax
                                     (*(span<const_slang::syntax::AttributeInstanceSyntax_*const,_18446744073709551615UL>
                                        *)(sVar6 + 0x40),(Scope *)local_2a8._0_8_,lookupLocation_04)
                  ;
                  if (*(long *)(sVar6 + 0x78) == 0) {
                    SVar59 = parsing::Token::range((Token *)(sVar6 + 0x60));
                    bVar14 = false;
                    goto LAB_0036f685;
                  }
                  pPVar25 = *(PropertyExprSyntax **)(sVar6 + 0x80);
                  if (pPVar25 != (PropertyExprSyntax *)0x0) goto LAB_0036ed8d;
                  pDVar19 = Scope::addDiag((Scope *)local_2a8._0_8_,(DiagCode)0x530006,
                                           *(SourceLocation *)(local_2a8._8_8_ + 0x18));
                  Diagnostic::operator<<(pDVar19,(args->super_Symbol).name);
                  goto LAB_0036efd0;
                }
                uVar15 = (uint)local_2f0 - 1 & (uint)local_2f0;
              } while (uVar15 != 0);
              bVar32 = local_308->m[0xf].n;
              uVar28 = local_2f8;
              pbVar29 = local_310;
              uVar26 = local_300;
              uVar41 = local_2d8;
              uVar42 = uStack_2d7;
              uVar43 = uStack_2d6;
              bVar44 = bStack_2d5;
              uVar45 = uStack_2d4;
              uVar46 = uStack_2d3;
              uVar47 = uStack_2d2;
              bVar48 = bStack_2d1;
              uVar49 = uStack_2d0;
              uVar50 = uStack_2cf;
              uVar51 = uStack_2ce;
              bVar52 = bStack_2cd;
              uVar53 = uStack_2cc;
              uVar54 = uStack_2cb;
              uVar55 = uStack_2ca;
              bVar56 = bStack_2c9;
            }
            if (((&boost::unordered::detail::foa::
                   group15<boost::unordered::detail::foa::plain_integral>::
                   is_not_overflowed(unsigned_long)::shift)[(uint)uVar21 & 7] & bVar32) == 0) break;
            lVar27 = uVar28 + uVar26;
            uVar26 = uVar26 + 1;
            uVar28 = lVar27 + 1U &
                     local_130.
                     super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_std::pair<const_slang::syntax::NamedPortConnectionSyntax_*,_bool>_>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char>,_std::pair<const_slang::syntax::NamedPortConnectionSyntax_*,_bool>_>,_256UL>_>
                     .arrays.groups_size_mask;
          } while (uVar26 <= local_130.
                             super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_std::pair<const_slang::syntax::NamedPortConnectionSyntax_*,_bool>_>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char>,_std::pair<const_slang::syntax::NamedPortConnectionSyntax_*,_bool>_>,_256UL>_>
                             .arrays.groups_size_mask);
          if (local_d7 != true) {
            pDVar19 = Scope::addDiag((Scope *)local_2a8._0_8_,(DiagCode)0x530006,
                                     *(SourceLocation *)(local_2a8._8_8_ + 0x18));
            Diagnostic::operator<<(pDVar19,(args->super_Symbol).name);
            goto LAB_0036efd0;
          }
          bVar14 = true;
          sVar58 = local_f8;
          SVar59 = local_e8;
LAB_0036f685:
          pPVar20 = anon_unknown_0::PortConnectionBuilder::getImplicitInterface
                              ((PortConnectionBuilder *)local_2a8,(InterfacePortSymbol *)args,SVar59
                               ,sVar58,bVar14);
        }
LAB_0036eff1:
        local_2e8._0_8_ = pPVar20;
        SmallVectorBase<slang::ast::PortConnection_const*>::
        emplace_back<slang::ast::PortConnection_const*const&>
                  ((SmallVectorBase<slang::ast::PortConnection_const*> *)local_2c0,
                   (PortConnection **)&local_2e8);
      }
      instance = (InstanceSymbol *)&(instance->super_InstanceSymbolBase).super_Symbol.name;
    } while (instance != (InstanceSymbol *)(&(pIVar11->super_Symbol).kind + (long)ports._M_ptr * 2))
    ;
  }
  if (local_d8 == true) {
    if (local_90 < (ulong)local_2a8._56_8_) {
      local_2e8 = slang::syntax::SyntaxNode::getFirstToken
                            (&(*(pointer)(local_2a8._48_8_ + local_90 * 8))->super_SyntaxNode);
      SVar18 = parsing::Token::location(&local_2e8);
      pDVar19 = Scope::addDiag((Scope *)local_2a8._0_8_,(DiagCode)0xc80006,SVar18);
      Diagnostic::operator<<
                (pDVar19,*(string_view *)
                          ((*(ModportSymbol **)(local_2a8._8_8_ + 0x50))[1].super_Symbol.name._M_str
                          + 8));
      std::
      vector<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>,_std::allocator<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>_>_>
      ::emplace_back<unsigned_long>(&pDVar19->args,(unsigned_long *)&local_2e8);
      local_2e8.kind = (undefined2)local_90;
      local_2e8._2_1_ = local_90._2_1_;
      local_2e8.numFlags.raw = local_90._3_1_;
      local_2e8.rawLen = local_90._4_4_;
      std::
      vector<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>,_std::allocator<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>_>_>
      ::emplace_back<unsigned_long>(&pDVar19->args,(unsigned_long *)&local_2e8);
    }
  }
  else {
    iVar60 = boost::unordered::detail::foa::
             table<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedPortConnectionSyntax_*,_bool>_>,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedPortConnectionSyntax_*,_bool>_>,_256UL,_16UL>_>
             ::begin(&local_130);
    if (iVar60.p_ != (table_element_pointer)0x0) {
LAB_0036f736:
      do {
        this_00 = local_2a8._0_8_;
        ppVar30 = iVar60.p_;
        if ((ppVar30->second).second == false) {
          SVar18 = parsing::Token::location(&((ppVar30->second).first)->name);
          pDVar19 = Scope::addDiag((Scope *)this_00,(DiagCode)0xa00006,SVar18);
          arg = parsing::Token::valueText(&((ppVar30->second).first)->name);
          Diagnostic::operator<<(pDVar19,arg);
          Diagnostic::operator<<
                    (pDVar19,*(string_view *)
                              ((*(ModportSymbol **)(local_2a8._8_8_ + 0x50))[1].super_Symbol.name.
                               _M_str + 8));
        }
        puVar24 = iVar60.pc_ + 0x12;
        puVar33 = iVar60.pc_ + 2;
        while( true ) {
          puVar22 = puVar33;
          puVar33 = iVar60.pc_;
          ppVar30 = iVar60.p_ + 1;
          if (((uint)iVar60.pc_ & 0xf) == 0xe) break;
          iVar60.p_ = ppVar30;
          iVar60.pc_ = puVar33 + 1;
          puVar24 = puVar24 + 1;
          puVar33 = puVar22 + 1;
          if (puVar22[-1] != '\0') goto code_r0x0036f7ca;
        }
        auVar39[0] = -(*puVar22 == '\0');
        auVar39[1] = -(puVar22[1] == '\0');
        auVar39[2] = -(puVar22[2] == '\0');
        auVar39[3] = -(puVar22[3] == '\0');
        auVar39[4] = -(puVar22[4] == '\0');
        auVar39[5] = -(puVar22[5] == '\0');
        auVar39[6] = -(puVar22[6] == '\0');
        auVar39[7] = -(puVar22[7] == '\0');
        auVar39[8] = -(puVar22[8] == '\0');
        auVar39[9] = -(puVar22[9] == '\0');
        auVar39[10] = -(puVar22[10] == '\0');
        auVar39[0xb] = -(puVar22[0xb] == '\0');
        auVar39[0xc] = -(puVar22[0xc] == '\0');
        auVar39[0xd] = -(puVar22[0xd] == '\0');
        auVar39[0xe] = -(puVar22[0xe] == '\0');
        auVar39[0xf] = -(puVar22[0xf] == '\0');
        uVar8 = (ushort)(SUB161(auVar39 >> 7,0) & 1) | (ushort)(SUB161(auVar39 >> 0xf,0) & 1) << 1 |
                (ushort)(SUB161(auVar39 >> 0x17,0) & 1) << 2 |
                (ushort)(SUB161(auVar39 >> 0x1f,0) & 1) << 3 |
                (ushort)(SUB161(auVar39 >> 0x27,0) & 1) << 4 |
                (ushort)(SUB161(auVar39 >> 0x2f,0) & 1) << 5 |
                (ushort)(SUB161(auVar39 >> 0x37,0) & 1) << 6 |
                (ushort)(SUB161(auVar39 >> 0x3f,0) & 1) << 7 |
                (ushort)(SUB161(auVar39 >> 0x47,0) & 1) << 8 |
                (ushort)(SUB161(auVar39 >> 0x4f,0) & 1) << 9 |
                (ushort)(SUB161(auVar39 >> 0x57,0) & 1) << 10 |
                (ushort)(SUB161(auVar39 >> 0x5f,0) & 1) << 0xb |
                (ushort)(SUB161(auVar39 >> 0x67,0) & 1) << 0xc |
                (ushort)(SUB161(auVar39 >> 0x6f,0) & 1) << 0xd |
                (ushort)(SUB161(auVar39 >> 0x77,0) & 1) << 0xe;
        while (uVar8 == 0x7fff) {
          ppVar30 = ppVar30 + 0xf;
          auVar40[0] = -(*puVar24 == '\0');
          auVar40[1] = -(puVar24[1] == '\0');
          auVar40[2] = -(puVar24[2] == '\0');
          auVar40[3] = -(puVar24[3] == '\0');
          auVar40[4] = -(puVar24[4] == '\0');
          auVar40[5] = -(puVar24[5] == '\0');
          auVar40[6] = -(puVar24[6] == '\0');
          auVar40[7] = -(puVar24[7] == '\0');
          auVar40[8] = -(puVar24[8] == '\0');
          auVar40[9] = -(puVar24[9] == '\0');
          auVar40[10] = -(puVar24[10] == '\0');
          auVar40[0xb] = -(puVar24[0xb] == '\0');
          auVar40[0xc] = -(puVar24[0xc] == '\0');
          auVar40[0xd] = -(puVar24[0xd] == '\0');
          auVar40[0xe] = -(puVar24[0xe] == '\0');
          auVar40[0xf] = -(puVar24[0xf] == '\0');
          puVar22 = puVar24;
          puVar24 = puVar24 + 0x10;
          uVar8 = (ushort)(SUB161(auVar40 >> 7,0) & 1) | (ushort)(SUB161(auVar40 >> 0xf,0) & 1) << 1
                  | (ushort)(SUB161(auVar40 >> 0x17,0) & 1) << 2 |
                  (ushort)(SUB161(auVar40 >> 0x1f,0) & 1) << 3 |
                  (ushort)(SUB161(auVar40 >> 0x27,0) & 1) << 4 |
                  (ushort)(SUB161(auVar40 >> 0x2f,0) & 1) << 5 |
                  (ushort)(SUB161(auVar40 >> 0x37,0) & 1) << 6 |
                  (ushort)(SUB161(auVar40 >> 0x3f,0) & 1) << 7 |
                  (ushort)(SUB161(auVar40 >> 0x47,0) & 1) << 8 |
                  (ushort)(SUB161(auVar40 >> 0x4f,0) & 1) << 9 |
                  (ushort)(SUB161(auVar40 >> 0x57,0) & 1) << 10 |
                  (ushort)(SUB161(auVar40 >> 0x5f,0) & 1) << 0xb |
                  (ushort)(SUB161(auVar40 >> 0x67,0) & 1) << 0xc |
                  (ushort)(SUB161(auVar40 >> 0x6f,0) & 1) << 0xd |
                  (ushort)(SUB161(auVar40 >> 0x77,0) & 1) << 0xe;
        }
        uVar15 = 0;
        if ((uVar8 ^ 0x7fff) != 0) {
          for (; ((uVar8 ^ 0x7fff) >> uVar15 & 1) == 0; uVar15 = uVar15 + 1) {
          }
        }
        if (puVar22[uVar15] == '\x01') break;
        iVar60.p_ = (table_element_pointer)((long)&(ppVar30->first)._M_len + (ulong)(uVar15 << 5));
        iVar60.pc_ = puVar22 + uVar15;
      } while( true );
    }
  }
LAB_0036f6f9:
  makeConnections();
  return;
code_r0x0036f7ca:
  if (puVar22[-1] != '\x01') {
    iVar60.pc_ = puVar22 + -1;
    goto LAB_0036f736;
  }
  goto LAB_0036f6f9;
}

Assistant:

void PortConnection::makeConnections(
    const InstanceSymbol& instance, std::span<const Symbol* const> ports,
    const SeparatedSyntaxList<PortConnectionSyntax>& portConnections,
    SmallVector<const PortConnection*>& results) {

    PortConnectionBuilder builder(instance, portConnections);
    for (auto portBase : ports) {
        if (portBase->kind == SymbolKind::Port) {
            auto& port = portBase->as<PortSymbol>();
            auto conn = builder.getConnection(port);
            SLANG_ASSERT(conn);
            results.push_back(conn);
        }
        else if (portBase->kind == SymbolKind::MultiPort) {
            auto& port = portBase->as<MultiPortSymbol>();
            auto conn = builder.getConnection(port);
            SLANG_ASSERT(conn);
            results.push_back(conn);
        }
        else {
            auto& port = portBase->as<InterfacePortSymbol>();
            auto conn = builder.getIfaceConnection(port);
            SLANG_ASSERT(conn);
            results.push_back(conn);
        }
    }

    builder.finalize();
}